

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_CopyFromPacked_Test::TestBody
          (ExtensionSetTest_CopyFromPacked_Test *this)

{
  TestPackedExtensions message2;
  TestPackedExtensions message1;
  TestPackedExtensions TStack_68;
  TestPackedExtensions local_38;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&local_38,(Arena *)0x0);
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&TStack_68,(Arena *)0x0);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>(&local_38);
  proto2_unittest::TestPackedExtensions::CopyFrom(&TStack_68,&local_38);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&TStack_68);
  proto2_unittest::TestPackedExtensions::CopyFrom(&TStack_68,&local_38);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&TStack_68);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&TStack_68);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&local_38);
  return;
}

Assistant:

TEST(ExtensionSetTest, CopyFromPacked) {
  unittest::TestPackedExtensions message1, message2;

  TestUtil::SetPackedExtensions(&message1);
  message2.CopyFrom(message1);
  TestUtil::ExpectPackedExtensionsSet(message2);
  message2.CopyFrom(message1);  // exercise copy when fields already exist
  TestUtil::ExpectPackedExtensionsSet(message2);
}